

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_posix1e.c
# Opt level: O0

void test_acl_posix1e(void)

{
  mode_t mVar1;
  archive_entry *entry;
  acl_t *p;
  acl_t *in_stack_00000018;
  int i;
  archive_entry *ae;
  acl_t *in_stack_ffffffffffffffd8;
  acl_t *acls;
  wchar_t want_type;
  wchar_t in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  longlong in_stack_ffffffffffffffe8;
  acl_t *v1;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  wchar_t line;
  
  entry = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_entry_set_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)in_stack_ffffffffffffffd8);
  archive_entry_set_mode(entry,0x81ff);
  set_acls((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8,0);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  set_acls((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8,0);
  failure("One extended ACL should flag all ACLs to be returned.");
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  compare_acls(ae,in_stack_00000018,p._4_4_,(int)p);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  set_acls((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8,0);
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  acls = (acl_t *)0x0;
  assertion_equal_int((char *)entry,in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x122ba5,(void *)CONCAT44(p._4_4_,(int)p));
  compare_acls(ae,in_stack_00000018,p._4_4_,(int)p);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0543, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),acls);
  set_acls((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),acls,0);
  failure("Basic ACLs shouldn\'t be stored as extended ACLs");
  archive_entry_acl_reset
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (wchar_t)((ulong)acls >> 0x20));
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),acls);
  mVar1 = archive_entry_mode(entry);
  failure("Basic ACLs should set mode to 0142, not %04o",(ulong)(mVar1 & 0x1ff));
  archive_entry_mode(entry);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),acls);
  set_acls((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),acls,0);
  for (line = L'\0'; line < L'\a'; line = line + L'\x01') {
    v1 = acls_nfs4 + line;
    failure("Malformed ACL test #%d",(ulong)(uint)line);
    archive_entry_acl_add_entry
              ((archive_entry *)CONCAT44(line,in_stack_fffffffffffffff0),
               (wchar_t)((ulong)v1 >> 0x20),(wchar_t)v1,in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0,(char *)acls);
    want_type = L'\0';
    assertion_equal_int((char *)entry,line,(longlong)v1,
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x122d87,(void *)CONCAT44(p._4_4_,(int)p));
    archive_entry_acl_reset
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               want_type);
    acls = (acl_t *)0x0;
    assertion_equal_int((char *)entry,line,(longlong)v1,
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x122dc7,(void *)CONCAT44(p._4_4_,(int)p));
  }
  archive_entry_free((archive_entry *)0x122de1);
  return;
}

Assistant:

DEFINE_TEST(test_acl_posix1e)
{
	struct archive_entry *ae;
	int i;

	/* Create a simple archive_entry. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "file");
        archive_entry_set_mode(ae, S_IFREG | 0777);

	/* Basic owner/owning group should just update mode bits. */

	/*
	 * Note: This features of libarchive's ACL implementation
	 * shouldn't be relied on and should probably be removed.  It
	 * was done to identify trivial ACLs so we could avoid
	 * triggering unnecessary extensions.  It's better to identify
	 * trivial ACLs at the point they are being read from disk.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);


	/* With any extended ACL entry, we should read back a full set. */
	set_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]));
	failure("One extended ACL should flag all ACLs to be returned.");
	assert(4 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]), 0142);
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);


	/* A more extensive set of ACLs. */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	assertEqualInt(6, archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	compare_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]), 0543);
	failure("Basic ACLs should set mode to 0543, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0543);

	/*
	 * Check that clearing ACLs gets rid of them all by repeating
	 * the first test.
	 */
	set_acls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]));
	failure("Basic ACLs shouldn't be stored as extended ACLs");
	assert(0 == archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	failure("Basic ACLs should set mode to 0142, not %04o",
	    archive_entry_mode(ae)&0777);
	assert((archive_entry_mode(ae) & 0777) == 0142);

	/*
	 * Different types of malformed ACL entries that should
	 * fail when added to existing POSIX.1e ACLs.
	 */
	set_acls(ae, acls2, sizeof(acls2)/sizeof(acls2[0]));
	for (i = 0; i < (int)(sizeof(acls_nfs4)/sizeof(acls_nfs4[0])); ++i) {
		struct acl_t *p = &acls_nfs4[i];
		failure("Malformed ACL test #%d", i);
		assertEqualInt(ARCHIVE_FAILED,
		    archive_entry_acl_add_entry(ae,
			p->type, p->permset, p->tag, p->qual, p->name));
		assertEqualInt(6,
		    archive_entry_acl_reset(ae,
			ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	}
	archive_entry_free(ae);
}